

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

void __thiscall pybind11::detail::local_internals::local_internals(local_internals *this)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  *this_00;
  mapped_type *ppvVar1;
  shared_loader_life_support_data *this_01;
  allocator<char> local_51;
  key_type local_50;
  mapped_type *local_30;
  mapped_type *ptr;
  internals *local_18;
  internals *internals;
  local_internals *this_local;
  
  internals = (internals *)this;
  std::
  unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
  ::unordered_map(&this->registered_types_cpp);
  std::
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  ::forward_list(&this->registered_exception_translators);
  this->loader_life_support_tls_key = (Py_tss_t *)0x0;
  local_18 = get_internals();
  this_00 = &local_18->shared_data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"_life_support",&local_51);
  ppvVar1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_30 = ppvVar1;
  if (*ppvVar1 == (mapped_type)0x0) {
    this_01 = (shared_loader_life_support_data *)operator_new(8);
    shared_loader_life_support_data::shared_loader_life_support_data(this_01);
    *local_30 = this_01;
  }
  this->loader_life_support_tls_key = **local_30;
  return;
}

Assistant:

local_internals() {
        auto &internals = get_internals();
        // Get or create the `loader_life_support_stack_key`.
        auto &ptr = internals.shared_data["_life_support"];
        if (!ptr) {
            ptr = new shared_loader_life_support_data;
        }
        loader_life_support_tls_key
            = static_cast<shared_loader_life_support_data *>(ptr)->loader_life_support_tls_key;
    }